

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.hpp
# Opt level: O1

void __thiscall OpenMD::PrepareVisitor::PrepareVisitor(PrepareVisitor *this)

{
  (this->super_BaseVisitor).visitorName._M_dataplus._M_p =
       (pointer)&(this->super_BaseVisitor).visitorName.field_2;
  (this->super_BaseVisitor).visitorName._M_string_length = 0;
  (this->super_BaseVisitor).visitorName.field_2._M_local_buf[0] = '\0';
  (this->super_BaseVisitor)._vptr_BaseVisitor = (_func_int **)&PTR__BaseVisitor_002bf408;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_BaseVisitor).visitorName,0,(char *)0x0,0x25b1c3);
  return;
}

Assistant:

PrepareVisitor() : BaseVisitor() { visitorName = "prepareVisitor"; }